

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O3

void Vec_QueUpdate(Vec_Que_t *p,int v)

{
  float *pfVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pfVar1 = *p->pCostsFlt;
  if (pfVar1 == (float *)0x0) {
    fVar12 = (float)v;
  }
  else {
    fVar12 = pfVar1[v];
  }
  piVar2 = p->pOrder;
  uVar6 = piVar2[v];
  uVar7 = (ulong)(int)uVar6;
  if (uVar7 == 0xffffffffffffffff) {
    __assert_fail("p->pOrder[v] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                  ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  piVar3 = p->pHeap;
  if (piVar3[uVar7] != v) {
    __assert_fail("p->pHeap[i] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                  ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  if ((int)uVar6 < 2) {
    piVar3[uVar7] = v;
    piVar2[v] = uVar6;
LAB_003df2ff:
    if (pfVar1 == (float *)0x0) {
      fVar12 = (float)v;
    }
    else {
      fVar12 = pfVar1[v];
    }
    uVar6 = piVar2[v];
    uVar4 = uVar6 * 2;
    iVar8 = p->nSize;
    if ((int)uVar4 < iVar8) {
      do {
        uVar5 = uVar4 | 1;
        uVar11 = uVar4;
        if ((int)uVar5 < iVar8) {
          if (pfVar1 == (float *)0x0) {
            fVar13 = (float)piVar3[(int)uVar4];
            fVar14 = (float)piVar3[(int)uVar5];
          }
          else {
            fVar13 = pfVar1[piVar3[(int)uVar4]];
            fVar14 = pfVar1[piVar3[(int)uVar5]];
          }
          if (fVar13 < fVar14) {
            uVar11 = uVar5;
          }
        }
        if (iVar8 <= (int)uVar11) {
          __assert_fail("child < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecQue.h"
                        ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
        }
        iVar8 = piVar3[(int)uVar11];
        if (pfVar1 == (float *)0x0) {
          fVar13 = (float)iVar8;
        }
        else {
          fVar13 = pfVar1[iVar8];
        }
        if (fVar13 <= fVar12) break;
        piVar3[(int)uVar6] = iVar8;
        piVar2[iVar8] = uVar6;
        uVar4 = uVar11 * 2;
        iVar8 = p->nSize;
        uVar6 = uVar11;
      } while ((int)uVar4 < iVar8);
    }
    piVar3[(int)uVar6] = v;
    piVar2[v] = uVar6;
  }
  else {
    bVar10 = true;
    uVar9 = (ulong)uVar6;
    do {
      uVar9 = uVar9 >> 1;
      iVar8 = piVar3[uVar9];
      if (pfVar1 == (float *)0x0) {
        fVar13 = (float)iVar8;
      }
      else {
        fVar13 = pfVar1[iVar8];
      }
      uVar6 = (uint)uVar7;
      if (fVar12 <= fVar13) {
        piVar3[uVar7 & 0xffffffff] = v;
        piVar2[v] = uVar6;
        if (!bVar10) {
          return;
        }
        goto LAB_003df2ff;
      }
      piVar3[uVar7 & 0xffffffff] = iVar8;
      piVar2[iVar8] = uVar6;
      bVar10 = false;
      uVar7 = uVar9;
    } while (3 < uVar6);
    piVar3[uVar9] = v;
    piVar2[v] = (int)uVar9;
  }
  return;
}

Assistant:

static inline int Vec_QueMoveUp( Vec_Que_t * p, int v )
{
    float Cost = Vec_QuePrio(p, v);
    int i      = p->pOrder[v];
    int parent = i >> 1;
    int fMoved = 0;
    assert( p->pOrder[v] != -1 );
    assert( p->pHeap[i] == v );
    while ( i > 1 && Cost > Vec_QuePrio(p, p->pHeap[parent]) )
    {
        p->pHeap[i]            = p->pHeap[parent];
        p->pOrder[p->pHeap[i]] = i;
        i                      = parent;
        parent                 = i >> 1;
        fMoved                 = 1;
    }
    p->pHeap[i]  = v;
    p->pOrder[v] = i;
    return fMoved;
}